

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
write_decimal<long_long>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *this,
          longlong value)

{
  basic_buffer<char> *pbVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  undefined1 *puVar5;
  byte bVar6;
  ulong uVar7;
  uint uVar8;
  ptrdiff_t _Num;
  ulong __n;
  ulong uVar9;
  char *__dest;
  char_type buffer [26];
  undefined1 auStack_58 [40];
  
  uVar7 = -value;
  if (0 < value) {
    uVar7 = value;
  }
  lVar4 = 0x3f;
  if ((uVar7 | 1) != 0) {
    for (; (uVar7 | 1) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  uVar8 = ((uint)lVar4 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  __n = (ulong)((uVar8 - (uVar7 < *(ulong *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_64 +
                                            (ulong)uVar8 * 8))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar9 = (sVar2 - (value >> 0x3f)) + __n;
  if (pbVar1->capacity_ < uVar9) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar9);
  }
  __dest = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar9;
  if (value < 0) {
    *__dest = '-';
    __dest = __dest + 1;
  }
  puVar5 = auStack_58 + __n;
  uVar9 = uVar7;
  if (99 < uVar7) {
    do {
      uVar7 = uVar9 / 100;
      *(undefined2 *)(puVar5 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uint)((int)uVar9 + (int)uVar7 * -100) * 2)
      ;
      puVar5 = puVar5 + -2;
      bVar3 = 9999 < uVar9;
      uVar9 = uVar7;
    } while (bVar3);
  }
  if (uVar7 < 10) {
    bVar6 = (byte)uVar7 | 0x30;
    lVar4 = -1;
  }
  else {
    puVar5[-1] = internal::basic_data<void>::DIGITS[(uVar7 * 2 & 0xffffffff) + 1];
    bVar6 = internal::basic_data<void>::DIGITS[uVar7 * 2 & 0x1fffffffe];
    lVar4 = -2;
  }
  puVar5[lVar4] = bVar6;
  if (__n != 0) {
    memcpy(__dest,auStack_58,__n);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }